

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<pstore::brokerface::message_type_const&>::
GetDescriberImpl<testing::internal::MatcherBase<pstore::brokerface::message_type_const&>::ValuePolicy<testing::internal::EqMatcher<pstore::brokerface::message_type>,false>>
          (MatcherBase<const_pstore::brokerface::message_type_&> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<const_message_type_&>_*,_const_EqMatcher<message_type>_*>_>
  *ppMVar1;
  MatcherBase<const_pstore::brokerface::message_type_&> *local_28;
  tuple<const_testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>_*,_const_testing::internal::EqMatcher<pstore::brokerface::message_type>_*>
  local_20;
  MatcherBase<const_pstore::brokerface::message_type_&> *local_10;
  MatcherBase<const_pstore::brokerface::message_type_&> *m_local;
  
  local_28 = m;
  local_10 = m;
  MatcherBase<const_pstore::brokerface::message_type_&>::
  ValuePolicy<testing::internal::EqMatcher<pstore::brokerface::message_type>,_false>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<pstore::brokerface::message_type_const&>const*,testing::internal::EqMatcher<pstore::brokerface::message_type>const*>
            ((MatcherBase<const_pstore::brokerface::message_type_&> **)&local_20,
             (EqMatcher<pstore::brokerface::message_type> **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<pstore::brokerface::message_type_const&>const*,testing::internal::EqMatcher<pstore::brokerface::message_type>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }